

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

Statement *
slang::ast::DisableStatement::fromSyntax
          (Compilation *comp,DisableStatementSyntax *syntax,ASTContext *context)

{
  SourceRange sourceRange;
  bool bVar1;
  SourceLocation this;
  Statement *pSVar2;
  Symbol *pSVar3;
  SubroutineSymbol *pSVar4;
  SourceLocation in_RDX;
  ASTContext *in_RDI;
  Symbol *symbol;
  Expression *targetExpr;
  ASTContext *in_stack_00000290;
  NameSyntax *in_stack_00000298;
  Compilation *in_stack_000002a0;
  bitmask<slang::ast::LookupFlags> in_stack_000002ac;
  Statement *in_stack_ffffffffffffff68;
  Compilation *in_stack_ffffffffffffff70;
  SourceRange *in_stack_ffffffffffffff80;
  SourceLocation SVar5;
  DiagCode code;
  undefined1 in_stack_ffffffffffffffa0 [16];
  undefined1 in_stack_ffffffffffffffb0 [16];
  unkbyte9 Var6;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar7;
  bitmask<slang::ast::LookupFlags> local_2c;
  Expression *local_28;
  SourceLocation local_20;
  DisableStatement *local_8;
  
  code = in_stack_ffffffffffffffa0._4_4_;
  Var6 = in_stack_ffffffffffffffb0._7_9_;
  local_20 = in_RDX;
  this = (SourceLocation)
         not_null<slang::syntax::NameSyntax_*>::operator*
                   ((not_null<slang::syntax::NameSyntax_*> *)0xa4ab0a);
  memset(&local_2c,0,4);
  bitmask<slang::ast::LookupFlags>::bitmask(&local_2c);
  local_28 = ArbitrarySymbolExpression::fromSyntax
                       (in_stack_000002a0,in_stack_00000298,in_stack_00000290,in_stack_000002ac);
  bVar1 = Expression::bad((Expression *)in_stack_ffffffffffffff70);
  if (!bVar1) {
    pSVar3 = Expression::getSymbolReference((Expression *)((unkuint9)Var6 >> 8),SUB91(Var6,0));
    if ((pSVar3->kind == StatementBlock) ||
       ((SVar5 = local_20, pSVar3->kind == Subroutine &&
        (pSVar4 = Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0xa4abb7), SVar5 = local_20,
        pSVar4->subroutineKind == Task)))) {
      slang::syntax::SyntaxNode::sourceRange
                ((SyntaxNode *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      local_8 = BumpAllocator::
                emplace<slang::ast::DisableStatement,slang::ast::Expression&,slang::SourceRange>
                          ((BumpAllocator *)this,(Expression *)in_RDI,in_stack_ffffffffffffff80);
    }
    else {
      uVar7 = 0x230008;
      not_null<slang::syntax::NameSyntax_*>::operator->
                ((not_null<slang::syntax::NameSyntax_*> *)0xa4abe5);
      slang::syntax::SyntaxNode::sourceRange
                ((SyntaxNode *)CONCAT44(uVar7,in_stack_ffffffffffffffc0));
      sourceRange.endLoc = SVar5;
      sourceRange.startLoc = this;
      ASTContext::addDiag(in_RDI,code,sourceRange);
      local_8 = (DisableStatement *)
                Statement::badStmt(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    return &local_8->super_Statement;
  }
  pSVar2 = Statement::badStmt(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  return pSVar2;
}

Assistant:

Statement& DisableStatement::fromSyntax(Compilation& comp, const DisableStatementSyntax& syntax,
                                        const ASTContext& context) {
    auto& targetExpr = ArbitrarySymbolExpression::fromSyntax(comp, *syntax.name, context);
    if (targetExpr.bad())
        return badStmt(comp, nullptr);

    auto symbol = targetExpr.getSymbolReference();
    SLANG_ASSERT(symbol);

    if (symbol->kind != SymbolKind::StatementBlock &&
        (symbol->kind != SymbolKind::Subroutine ||
         symbol->as<SubroutineSymbol>().subroutineKind != SubroutineKind::Task)) {
        context.addDiag(diag::InvalidDisableTarget, syntax.name->sourceRange());
        return badStmt(comp, nullptr);
    }

    return *comp.emplace<DisableStatement>(targetExpr, syntax.sourceRange());
}